

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  locale_ref in_RCX;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDX;
  undefined1 in_SIL;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  basic_format_specs<char> *in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffd7;
  undefined3 in_stack_ffffffffffffffe4;
  int value_00;
  undefined8 local_8;
  
  value_00 = CONCAT13(in_SIL,in_stack_ffffffffffffffe4);
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>
                    (in_stack_ffffffffffffffb8,(error_handler *)0x138729);
  if (bVar1) {
    local_8 = (buffer<char> *)
              write_char<char,fmt::v8::appender>
                        (in_RDX.container,in_stack_ffffffffffffffd7,in_RDI.container);
  }
  else {
    local_8 = (buffer<char> *)
              write<char,_fmt::v8::appender,_int,_0>
                        (in_RDI.container,value_00,in_RDX.container,in_RCX);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}